

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<unsigned_long&,char_const(&)[2],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,unsigned_long *params,char (*params_1) [2],
          unsigned_long *params_2)

{
  kj *pkVar1;
  char (*value) [2];
  unsigned_long *value_00;
  unsigned_long *value_01;
  CappedArray<char,_26UL> local_88;
  ArrayPtr<const_char> local_60;
  CappedArray<char,_26UL> local_50;
  char (*local_28) [2];
  unsigned_long *params_local_2;
  char (*params_local_1) [2];
  unsigned_long *params_local;
  
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [2])this;
  params_local = (unsigned_long *)__return_storage_ptr__;
  pkVar1 = (kj *)fwd<unsigned_long&>((unsigned_long *)this);
  toCharSequence<unsigned_long&>(&local_50,pkVar1,value_00);
  value = ::const((char (*) [2])params_local_2);
  local_60 = toCharSequence<char_const(&)[2]>(value);
  pkVar1 = (kj *)fwd<unsigned_long&>((unsigned_long *)local_28);
  toCharSequence<unsigned_long&>(&local_88,pkVar1,value_01);
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_50,(CappedArray<char,_26UL> *)&local_60,
             (ArrayPtr<const_char> *)&local_88,(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}